

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O3

vector<Range,_std::allocator<Range>_> *
subtractRanges(vector<Range,_std::allocator<Range>_> *__return_storage_ptr__,
              vector<Range,_std::allocator<Range>_> *ranges,
              vector<Range,_std::allocator<Range>_> *subtractions)

{
  int iVar1;
  pointer pRVar2;
  long lVar3;
  Range *split_range;
  pointer __args;
  Datetime *pDVar4;
  Datetime *pDVar5;
  pointer this;
  byte bVar6;
  vector<Range,_std::allocator<Range>_> split_results;
  Range *local_80;
  undefined8 local_78;
  iterator iStack_70;
  Range *local_68;
  pointer local_58;
  pointer local_50;
  vector<Range,_std::allocator<Range>_> local_48;
  
  bVar6 = 0;
  std::vector<Range,_std::allocator<Range>_>::vector(__return_storage_ptr__,ranges);
  local_80 = (subtractions->super__Vector_base<Range,_std::allocator<Range>_>)._M_impl.
             super__Vector_impl_data._M_start;
  local_58 = (subtractions->super__Vector_base<Range,_std::allocator<Range>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  if (local_80 != local_58) {
    do {
      local_78 = 0;
      iStack_70._M_current = (Range *)0x0;
      local_68 = (Range *)0x0;
      this = (__return_storage_ptr__->super__Vector_base<Range,_std::allocator<Range>_>)._M_impl.
             super__Vector_impl_data._M_start;
      local_50 = (__return_storage_ptr__->super__Vector_base<Range,_std::allocator<Range>_>)._M_impl
                 .super__Vector_impl_data._M_finish;
      if (this != local_50) {
        do {
          Range::subtract(&local_48,this,local_80);
          pRVar2 = local_48.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (__args = local_48.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                        super__Vector_impl_data._M_start; __args != pRVar2; __args = __args + 1) {
            if (iStack_70._M_current == local_68) {
              std::vector<Range,std::allocator<Range>>::_M_realloc_insert<Range_const&>
                        ((vector<Range,std::allocator<Range>> *)&local_78,iStack_70,__args);
            }
            else {
              (iStack_70._M_current)->_vptr_Range = (_func_int **)&PTR__Range_0019f778;
              pDVar4 = &__args->start;
              pDVar5 = &(iStack_70._M_current)->start;
              for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
                iVar1 = pDVar4->_month;
                pDVar5->_year = pDVar4->_year;
                pDVar5->_month = iVar1;
                pDVar4 = (Datetime *)((long)pDVar4 + (ulong)bVar6 * -0x10 + 8);
                pDVar5 = (Datetime *)((long)pDVar5 + (ulong)bVar6 * -0x10 + 8);
              }
              iStack_70._M_current = iStack_70._M_current + 1;
            }
          }
          std::vector<Range,_std::allocator<Range>_>::~vector(&local_48);
          this = this + 1;
        } while (this != local_50);
      }
      std::vector<Range,_std::allocator<Range>_>::operator=
                (__return_storage_ptr__,(vector<Range,_std::allocator<Range>_> *)&local_78);
      std::vector<Range,_std::allocator<Range>_>::~vector
                ((vector<Range,_std::allocator<Range>_> *)&local_78);
      local_80 = local_80 + 1;
    } while (local_80 != local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector <Range> subtractRanges (
  const std::vector <Range>& ranges,
  const std::vector <Range>& subtractions)
{
  std::vector <Range> results = ranges;
  for (auto& s : subtractions)
  {
    std::vector <Range> split_results;
    for (auto& range : results)
      for (auto& split_range : range.subtract (s))
        split_results.push_back (split_range);

    results = split_results;
  }

  return results;
}